

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

SourceFileFlags __thiscall
cmGeneratorTarget::GetTargetSourceFileFlags(cmGeneratorTarget *this,cmSourceFile *sf)

{
  cmSourceFile *this_00;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  cmValue __lhs;
  _Base_ptr p_Var4;
  string_view str;
  SourceFileFlags SVar5;
  ulong uStack_60;
  allocator<char> local_49;
  cmSourceFile *sf_local;
  string local_40;
  
  sf_local = sf;
  ConstructSourceFileFlags(this);
  iVar3 = std::
          _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
          ::find(&(this->SourceFlagsMap)._M_t,&sf_local);
  this_00 = sf_local;
  if ((_Rb_tree_header *)iVar3._M_node == &(this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"MACOSX_PACKAGE_LOCATION",&local_49);
    __lhs = cmSourceFile::GetProperty(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (__lhs.Value == (string *)0x0) {
      uStack_60 = 0;
      p_Var4 = (_Base_ptr)0x0;
    }
    else {
      p_Var4 = (_Base_ptr)((__lhs.Value)->_M_dataplus)._M_p;
      iVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x30])
                        (this->GlobalGenerator,this->Makefile);
      bVar1 = std::operator==(__lhs.Value,"Resources");
      if (bVar1) {
        if ((char)iVar2 != '\0') {
          p_Var4 = (_Base_ptr)0x61ebb9;
        }
        uStack_60 = 3;
      }
      else {
        str._M_str = ((__lhs.Value)->_M_dataplus)._M_p;
        str._M_len = (__lhs.Value)->_M_string_length;
        bVar1 = cmHasLiteralPrefix<11ul>(str,(char (*) [11])"Resources/");
        if (bVar1) {
          if ((char)iVar2 != '\0') {
            p_Var4 = (_Base_ptr)((long)&p_Var4->_M_parent + 2);
          }
          uStack_60 = 4;
        }
        else {
          uStack_60 = 5;
        }
      }
    }
  }
  else {
    uStack_60 = (ulong)*(uint *)&iVar3._M_node[1]._M_parent;
    p_Var4 = iVar3._M_node[1]._M_left;
  }
  SVar5.MacFolder = (char *)p_Var4;
  SVar5._0_8_ = uStack_60;
  return SVar5;
}

Assistant:

struct cmGeneratorTarget::SourceFileFlags
cmGeneratorTarget::GetTargetSourceFileFlags(const cmSourceFile* sf) const
{
  struct SourceFileFlags flags;
  this->ConstructSourceFileFlags();
  auto si = this->SourceFlagsMap.find(sf);
  if (si != this->SourceFlagsMap.end()) {
    flags = si->second;
  } else {
    // Handle the MACOSX_PACKAGE_LOCATION property on source files that
    // were not listed in one of the other lists.
    if (cmValue location = sf->GetProperty("MACOSX_PACKAGE_LOCATION")) {
      flags.MacFolder = location->c_str();
      const bool stripResources =
        this->GlobalGenerator->ShouldStripResourcePath(this->Makefile);
      if (*location == "Resources") {
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
        if (stripResources) {
          flags.MacFolder = "";
        }
      } else if (cmHasLiteralPrefix(*location, "Resources/")) {
        flags.Type = cmGeneratorTarget::SourceFileTypeDeepResource;
        if (stripResources) {
          flags.MacFolder += cmStrLen("Resources/");
        }
      } else {
        flags.Type = cmGeneratorTarget::SourceFileTypeMacContent;
      }
    }
  }
  return flags;
}